

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# umutablecptrie.cpp
# Opt level: O3

void __thiscall
icu_63::anon_unknown_0::MutableCodePointTrie::MutableCodePointTrie
          (MutableCodePointTrie *this,uint32_t iniValue,uint32_t errValue,UErrorCode *errorCode)

{
  uint32_t *puVar1;
  
  this->index = (uint32_t *)0x0;
  this->indexCapacity = 0;
  this->index3NullOffset = -1;
  this->data = (uint32_t *)0x0;
  this->dataCapacity = 0;
  this->dataLength = 0;
  this->dataNullOffset = -1;
  this->origInitialValue = iniValue;
  this->initialValue = iniValue;
  this->errorValue = errValue;
  this->highStart = 0;
  this->highValue = iniValue;
  this->index16 = (uint16_t *)0x0;
  if (*errorCode < U_ILLEGAL_ARGUMENT_ERROR) {
    puVar1 = (uint32_t *)uprv_malloc_63(0x4000);
    this->index = puVar1;
    puVar1 = (uint32_t *)uprv_malloc_63(0x10000);
    this->data = puVar1;
    if ((puVar1 == (uint32_t *)0x0) || (this->index == (uint32_t *)0x0)) {
      *errorCode = U_MEMORY_ALLOCATION_ERROR;
    }
    else {
      this->indexCapacity = 0x1000;
      this->dataCapacity = 0x4000;
    }
  }
  return;
}

Assistant:

MutableCodePointTrie::MutableCodePointTrie(uint32_t iniValue, uint32_t errValue, UErrorCode &errorCode) :
        origInitialValue(iniValue), initialValue(iniValue), errorValue(errValue),
        highStart(0), highValue(initialValue)
#ifdef UCPTRIE_DEBUG
        , name("open")
#endif
        {
    if (U_FAILURE(errorCode)) { return; }
    index = (uint32_t *)uprv_malloc(BMP_I_LIMIT * 4);
    data = (uint32_t *)uprv_malloc(INITIAL_DATA_LENGTH * 4);
    if (index == nullptr || data == nullptr) {
        errorCode = U_MEMORY_ALLOCATION_ERROR;
        return;
    }
    indexCapacity = BMP_I_LIMIT;
    dataCapacity = INITIAL_DATA_LENGTH;
}